

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  long in_RDI;
  ImDrawCmd draw_cmd;
  ImDrawCmd *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool bVar1;
  undefined8 *local_50;
  float local_3c;
  float fStack_38;
  float local_34;
  float fStack_30;
  
  ImDrawCmd::ImDrawCmd((ImDrawCmd *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  if (*(int *)(in_RDI + 0x60) == 0) {
    local_50 = (undefined8 *)(*(long *)(in_RDI + 0x38) + 0x1c);
  }
  else {
    local_50 = (undefined8 *)
               (*(long *)(in_RDI + 0x68) + (long)(*(int *)(in_RDI + 0x60) + -1) * 0x10);
  }
  local_3c = (float)*local_50;
  local_34 = (float)local_50[1];
  bVar1 = false;
  if (local_3c <= local_34) {
    fStack_38 = (float)((ulong)*local_50 >> 0x20);
    fStack_30 = (float)((ulong)local_50[1] >> 0x20);
    bVar1 = fStack_38 <= fStack_30;
  }
  if (bVar1 == false) {
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x1af,"void ImDrawList::AddDrawCmd()");
  }
  ImVector<ImDrawCmd>::push_back
            ((ImVector<ImDrawCmd> *)CONCAT17(bVar1,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();
    draw_cmd.VtxOffset = _VtxCurrentOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}